

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_sort.cc
# Opt level: O1

void print_usage(char *progname)

{
  size_t sVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Usage: ",7);
  if (progname == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x107130);
  }
  else {
    sVar1 = strlen(progname);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,progname,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," [-pa] [path]\n",0xe);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             " -p       - \'p\' letter is treated as \'patch\' instead of \'pre\'\n",0x3e);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             " -a       - any alphabetic characters are treated as post-release\n",0x42);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             " -v       - verbose mode (display whether version is different from the previous one)\n"
             ,0x56);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr," -h, -?   - print usage and exit\n",0x21);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr," -V       - print version and exit",0x22);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  return;
}

Assistant:

static void print_usage(const char* progname) {
	std::cerr << "Usage: " << progname << " [-pa] [path]\n";
	std::cerr << "\n";
	std::cerr << " -p       - 'p' letter is treated as 'patch' instead of 'pre'\n";
	std::cerr << " -a       - any alphabetic characters are treated as post-release\n";
	std::cerr << " -v       - verbose mode (display whether version is different from the previous one)\n";
	std::cerr << "\n";
	std::cerr << " -h, -?   - print usage and exit\n";
	std::cerr << " -V       - print version and exit" << std::endl;
}